

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O1

void __thiscall
tcu::TestLog::writeValueInfo
          (TestLog *this,string *name,string *description,string *unit,qpSampleValueTag tag)

{
  deBool dVar1;
  char *unit_00;
  LogWriteFailedError *this_00;
  
  unit_00 = (char *)unit->_M_string_length;
  if (unit_00 != (char *)0x0) {
    unit_00 = (unit->_M_dataplus)._M_p;
  }
  dVar1 = qpTestLog_writeValueInfo
                    (this->m_log,(name->_M_dataplus)._M_p,(description->_M_dataplus)._M_p,unit_00,
                     tag);
  if (dVar1 != 0) {
    return;
  }
  this_00 = (LogWriteFailedError *)__cxa_allocate_exception(0x38);
  LogWriteFailedError::LogWriteFailedError(this_00);
  __cxa_throw(this_00,&LogWriteFailedError::typeinfo,Exception::~Exception);
}

Assistant:

void TestLog::writeValueInfo (const std::string& name, const std::string& description, const std::string& unit, qpSampleValueTag tag)
{
	if (qpTestLog_writeValueInfo(m_log, name.c_str(), description.c_str(), unit.empty() ? DE_NULL : unit.c_str(), tag) == DE_FALSE)
		throw LogWriteFailedError();
}